

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufAdd(xmlBufPtr buf,xmlChar *str,int len)

{
  int iVar1;
  ulong uVar2;
  char *extra;
  ulong __n;
  size_t sVar3;
  
  if ((buf != (xmlBufPtr)0x0 && str != (xmlChar *)0x0) && (buf->error == 0)) {
    uVar2 = (ulong)buf->compat_size;
    if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
      buf->size = uVar2;
    }
    uVar2 = (ulong)buf->compat_use;
    if ((uVar2 < 0x7fffffff) && (buf->use != uVar2)) {
      buf->use = uVar2;
    }
    if ((-2 < len) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
      if (len == 0) {
        return 0;
      }
      if (len < 0) {
        len = xmlStrlen(str);
      }
      if (-1 < len) {
        if (len == 0) {
          return 0;
        }
        __n = (ulong)(uint)len;
        uVar2 = buf->use;
        if (__n < buf->size - uVar2) {
LAB_00136be2:
          memmove(buf->content + buf->use,str,__n);
          sVar3 = __n + buf->use;
          buf->use = sVar3;
          buf->content[sVar3] = '\0';
          uVar2 = buf->size;
          if (0x7ffffffe < uVar2) {
            uVar2 = 0x7fffffff;
          }
          buf->compat_size = (uint)uVar2;
          uVar2 = 0x7fffffff;
          if (buf->use < 0x7fffffff) {
            uVar2 = buf->use;
          }
          buf->compat_use = (uint)uVar2;
          return 0;
        }
        if (__n < ~uVar2) {
          sVar3 = __n + uVar2 + 1;
          if ((sVar3 < 10000000) || (buf->alloc != XML_BUFFER_ALLOC_BOUNDED)) {
            iVar1 = xmlBufResize(buf,sVar3);
            if (iVar1 == 0) {
              xmlBufMemoryError(buf,"growing buffer");
              return 2;
            }
            goto LAB_00136be2;
          }
          extra = "buffer error: text too long\n";
        }
        else {
          extra = "growing buffer past SIZE_MAX";
        }
        xmlBufMemoryError(buf,extra);
      }
    }
  }
  return -1;
}

Assistant:

int
xmlBufAdd(xmlBufPtr buf, const xmlChar *str, int len) {
    size_t needSize;

    if ((str == NULL) || (buf == NULL) || (buf->error))
	return -1;
    CHECK_COMPAT(buf)

    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return -1;
    if (len < -1) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufAdd: len < 0\n");
#endif
	return -1;
    }
    if (len == 0) return 0;

    if (len < 0)
        len = xmlStrlen(str);

    if (len < 0) return -1;
    if (len == 0) return 0;

    /* Note that both buf->size and buf->use can be zero here. */
    if ((size_t) len >= buf->size - buf->use) {
        if ((size_t) len >= SIZE_MAX - buf->use) {
            xmlBufMemoryError(buf, "growing buffer past SIZE_MAX");
            return(-1);
        }
        needSize = buf->use + len + 1;
	if (buf->alloc == XML_BUFFER_ALLOC_BOUNDED) {
	    /*
	     * Used to provide parsing limits
	     */
	    if (needSize >= XML_MAX_TEXT_LENGTH) {
		xmlBufMemoryError(buf, "buffer error: text too long\n");
		return(-1);
	    }
	}
        if (!xmlBufResize(buf, needSize)){
	    xmlBufMemoryError(buf, "growing buffer");
            return XML_ERR_NO_MEMORY;
        }
    }

    memmove(&buf->content[buf->use], str, len);
    buf->use += len;
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return 0;
}